

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O0

void __thiscall QtMWidgets::BusyIndicator::setRunning(BusyIndicator *this,bool on)

{
  BusyIndicatorPrivate *pBVar1;
  bool on_local;
  BusyIndicator *this_local;
  
  pBVar1 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
           ::operator->(&this->d);
  if (on != (bool)(pBVar1->running & 1U)) {
    pBVar1 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
             ::operator->(&this->d);
    pBVar1->running = on;
    pBVar1 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
             ::operator->(&this->d);
    if ((pBVar1->running & 1U) == 0) {
      QWidget::hide();
      QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
      ::operator->(&this->d);
      QAbstractAnimation::stop();
    }
    else {
      QWidget::show();
      pBVar1 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
               ::operator->(&this->d);
      QAbstractAnimation::start(pBVar1->animation,0);
    }
  }
  return;
}

Assistant:

void
BusyIndicator::setRunning( bool on )
{
	if( on != d->running )
	{
		d->running = on;

		if( d->running )
		{
			show();
			d->animation->start();
		}
		else
		{
			hide();
			d->animation->stop();
		}
	}
}